

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O1

int lzham::lzham_lib_z_deflate(lzham_z_streamp pStream,int flush)

{
  uint uVar1;
  uint uVar2;
  lzham_z_internal_state *p;
  int iVar3;
  int iVar4;
  lzham_compress_status_t lVar5;
  lzham_z_ulong lVar6;
  lzham_z_ulong lVar7;
  char cVar8;
  size_t out_bytes;
  size_t in_bytes;
  ulong local_50;
  ulong local_48;
  lzham_z_ulong local_40;
  lzham_z_ulong local_38;
  
  iVar4 = -2;
  if ((((pStream != (lzham_z_streamp)0x0) && ((uint)flush < 5)) &&
      (pStream->state != (lzham_z_internal_state *)0x0)) &&
     ((pStream->next_out != (uchar *)0x0 && (iVar4 = -5, pStream->avail_out != 0)))) {
    if (flush == 1) {
      flush = LZHAM_SYNC_FLUSH;
    }
    local_38 = pStream->total_in;
    local_40 = pStream->total_out;
    iVar4 = 0;
    do {
      local_48 = (ulong)pStream->avail_in;
      local_50 = (ulong)pStream->avail_out;
      p = pStream->state;
      lVar5 = lzham_lib_compress2(p,pStream->next_in,&local_48,pStream->next_out,&local_50,flush);
      pStream->next_in = pStream->next_in + (local_48 & 0xffffffff);
      uVar1 = pStream->avail_in;
      uVar2 = pStream->avail_out;
      pStream->avail_in = uVar1 - (uint)local_48;
      lVar6 = (local_48 & 0xffffffff) + pStream->total_in;
      pStream->total_in = lVar6;
      pStream->next_out = pStream->next_out + (local_50 & 0xffffffff);
      pStream->avail_out = uVar2 - (uint)local_50;
      lVar7 = (local_50 & 0xffffffff) + pStream->total_out;
      pStream->total_out = lVar7;
      pStream->adler = (ulong)*(uint *)(p + 0xac8);
      cVar8 = '\x02';
      iVar3 = -2;
      if (((lVar5 < LZHAM_COMP_STATUS_FAILED) &&
          (iVar3 = 1, lVar5 != LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE)) &&
         ((iVar3 = iVar4, uVar2 != (uint)local_50 &&
          (cVar8 = '\0', uVar1 == (uint)local_48 && flush != LZHAM_FINISH)))) {
        if ((flush == LZHAM_NO_FLUSH) && (lVar6 == local_38)) {
          cVar8 = (lVar7 != local_40) + '\x01';
        }
        else {
          cVar8 = '\x02';
        }
      }
      iVar4 = iVar3;
    } while (cVar8 == '\0');
    if (cVar8 != '\x02') {
      iVar4 = -5;
    }
  }
  return iVar4;
}

Assistant:

int lzham_lib_z_deflate(lzham_z_streamp pStream, int flush)
   {
      if ((!pStream) || (!pStream->state) || (flush < 0) || (flush > LZHAM_Z_FINISH) || (!pStream->next_out))
      {
         LZHAM_LOG_ERROR(6037);
         return LZHAM_Z_STREAM_ERROR;
      }

      if (!pStream->avail_out)
      {
         LZHAM_LOG_ERROR(6038);
         return LZHAM_Z_BUF_ERROR;
      }

      if (flush == LZHAM_Z_PARTIAL_FLUSH)
         flush = LZHAM_Z_SYNC_FLUSH;

      int lzham_status = LZHAM_Z_OK;
      lzham_z_ulong orig_total_in = pStream->total_in, orig_total_out = pStream->total_out;
      for ( ; ; )
      {
         size_t in_bytes = pStream->avail_in, out_bytes = pStream->avail_out;

         lzham_compress_state_ptr pComp = (lzham_compress_state_ptr)pStream->state;
         lzham_compress_state *pState = static_cast<lzham_compress_state*>(pComp);

         lzham_compress_status_t status = lzham_lib_compress2(
            pComp,
            pStream->next_in, &in_bytes,
            pStream->next_out, &out_bytes,
            (lzham_flush_t)flush);

         pStream->next_in += (uint)in_bytes;
         pStream->avail_in -= (uint)in_bytes;
         pStream->total_in += (uint)in_bytes;

         pStream->next_out += (uint)out_bytes;
         pStream->avail_out -= (uint)out_bytes;
         pStream->total_out += (uint)out_bytes;

         pStream->adler = pState->m_compressor.get_src_adler32();

         if (status >= LZHAM_COMP_STATUS_FIRST_FAILURE_CODE)
         {
            lzham_status = LZHAM_Z_STREAM_ERROR;
            LZHAM_LOG_ERROR(6039);
            break;
         }
         else if (status == LZHAM_COMP_STATUS_SUCCESS)
         {
            lzham_status = LZHAM_Z_STREAM_END;
            break;
         }
         else if (!pStream->avail_out)
            break;
         else if ((!pStream->avail_in) && (flush != LZHAM_Z_FINISH))
         {
            if ((flush) || (pStream->total_in != orig_total_in) || (pStream->total_out != orig_total_out))
               break;
            LZHAM_LOG_ERROR(6040);
            return LZHAM_Z_BUF_ERROR; // Can't make forward progress without some input.
         }
      }
      return lzham_status;
   }